

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ports.cpp
# Opt level: O3

bool __thiscall rtosc::Port_Matcher::hard_match(Port_Matcher *this,int i,char *msg)

{
  pointer pbVar1;
  char *pattern;
  bool bVar2;
  int iVar3;
  
  pbVar1 = (this->fixed).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  iVar3 = strncmp(msg,pbVar1[i]._M_dataplus._M_p,pbVar1[i]._M_string_length);
  if (iVar3 == 0) {
    pattern = (this->arg_spec).super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
              _M_impl.super__Vector_impl_data._M_start[i];
    if (pattern != (char *)0x0) {
      bVar2 = rtosc_match_args(this,pattern,msg);
      return bVar2;
    }
    bVar2 = true;
  }
  else {
    bVar2 = false;
  }
  return bVar2;
}

Assistant:

bool hard_match(int i, const char *msg)
        {
            if(strncmp(msg, fixed[i].c_str(), fixed[i].length()))
                return false;
            if(arg_spec[i])
                return rtosc_match_args(arg_spec[i], msg);
            else
                return true;
        }